

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

bool ccs::CcsContext::coerceString<bool>(string *s,bool *dest)

{
  bool *__lhs;
  __type _Var1;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  bool *local_20;
  bool *dest_local;
  string *s_local;
  
  local_20 = dest;
  dest_local = (bool *)s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"true",&local_41);
  _Var1 = std::operator==(s,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  __lhs = dest_local;
  if (_Var1) {
    *local_20 = true;
    s_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"false",&local_79);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (_Var1) {
      *local_20 = false;
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = false;
    }
  }
  return s_local._7_1_;
}

Assistant:

inline bool CcsContext::coerceString<bool>(const std::string &s,
    bool &dest) {
  // convert from a string to a bool: value must be exactly "true" or "false",
  // for maximum consistency with ccs boolean literals.
  if (s == std::string("true")) {
    dest = true;
    return true;
  }
  if (s == std::string("false")) {
    dest = false;
    return true;
  }
  return false;
}